

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlDOMWrapAdoptBranch
              (xmlDOMWrapCtxtPtr_conflict ctxt,xmlDocPtr sourceDoc,xmlNodePtr node,xmlDocPtr destDoc
              ,xmlNodePtr destParent,int options)

{
  xmlNsPtr pxVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  xmlNsMapItemPtr_conflict pxVar5;
  xmlNodePtr local_88;
  int ancestorsOnly;
  int parnsdone;
  int depth;
  xmlNsPtr ns;
  xmlNsMapItemPtr_conflict mi;
  xmlNsMapPtr nsMap;
  xmlNodePtr curElem;
  xmlNodePtr cur;
  int ret;
  int options_local;
  xmlNodePtr destParent_local;
  xmlDocPtr destDoc_local;
  xmlNodePtr node_local;
  xmlDocPtr sourceDoc_local;
  xmlDOMWrapCtxtPtr_conflict ctxt_local;
  
  cur._0_4_ = 0;
  nsMap = (xmlNsMapPtr)0x0;
  mi = (xmlNsMapItemPtr_conflict)0x0;
  _parnsdone = (xmlNsPtr)0x0;
  ancestorsOnly = -1;
  if (ctxt != (xmlDOMWrapCtxtPtr_conflict)0x0) {
    mi = (xmlNsMapItemPtr_conflict)ctxt->namespaceMap;
  }
  curElem = node;
  cur._4_4_ = options;
  _ret = destParent;
  destParent_local = (xmlNodePtr)destDoc;
  destDoc_local = (xmlDocPtr)node;
  node_local = (xmlNodePtr)sourceDoc;
  sourceDoc_local = (xmlDocPtr)ctxt;
  if ((destParent == (xmlNodePtr)0x0) ||
     ((ctxt != (xmlDOMWrapCtxtPtr_conflict)0x0 &&
      (ctxt->getNsForNodeFunc != (xmlDOMWrapAcquireNsFunction)0x0)))) {
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
LAB_0016fb34:
  if (curElem == (xmlNodePtr)0x0) {
LAB_0017005f:
    if (mi != (xmlNsMapItemPtr_conflict)0x0) {
      if ((sourceDoc_local == (xmlDocPtr)0x0) ||
         ((xmlNsMapItemPtr_conflict)sourceDoc_local->name != mi)) {
        xmlDOMWrapNsMapFree((xmlNsMapPtr)mi);
      }
      else if (mi->next != (xmlNsMapItemPtr)0x0) {
        if (mi->oldNs != (xmlNsPtr)0x0) {
          mi->prev->next = (xmlNsMapItemPtr)mi->oldNs;
        }
        mi->oldNs = (xmlNsPtr)mi->next;
        mi->next = (xmlNsMapItemPtr)0x0;
      }
    }
    return (int)cur;
  }
  if ((curElem->doc != (_xmlDoc *)destParent_local) &&
     (iVar4 = xmlNodeSetDoc(curElem,(xmlDocPtr)destParent_local), iVar4 < 0)) {
    cur._0_4_ = -1;
  }
  switch(curElem->type) {
  case XML_ELEMENT_NODE:
    nsMap = (xmlNsMapPtr)curElem;
    ancestorsOnly = ancestorsOnly + 1;
    if ((curElem->nsDef != (xmlNs *)0x0) &&
       ((sourceDoc_local == (xmlDocPtr)0x0 || (sourceDoc_local->children == (_xmlNode *)0x0)))) {
      if (!bVar3) {
        iVar4 = xmlDOMWrapNSNormGatherInScopeNs((xmlNsMapPtr *)&mi,_ret);
        if (iVar4 == -1) {
          cur._0_4_ = -1;
        }
        bVar3 = true;
      }
      for (_parnsdone = curElem->nsDef; _parnsdone != (xmlNsPtr)0x0; _parnsdone = _parnsdone->next)
      {
        if ((mi != (xmlNsMapItemPtr_conflict)0x0) && (mi->next != (xmlNsMapItemPtr)0x0)) {
          for (ns = (xmlNsPtr)mi->next; ns != (xmlNsPtr)0x0; ns = ns->next) {
            if (((-2 < *(int *)((long)&ns->_private + 4)) && (*(int *)&ns->_private == -1)) &&
               ((_parnsdone->prefix == *(xmlChar **)(ns->prefix + 0x18) ||
                (iVar4 = xmlStrEqual(_parnsdone->prefix,*(xmlChar **)(ns->prefix + 0x18)),
                iVar4 != 0)))) {
              *(int *)&ns->_private = ancestorsOnly;
            }
          }
        }
        pxVar5 = xmlDOMWrapNsMapAddItem((xmlNsMapPtr *)&mi,-1,_parnsdone,_parnsdone,ancestorsOnly);
        if (pxVar5 == (xmlNsMapItemPtr_conflict)0x0) {
          cur._0_4_ = -1;
        }
      }
    }
  case XML_ATTRIBUTE_NODE:
    if (curElem->ns != (xmlNs *)0x0) {
      if (!bVar3) {
        iVar4 = xmlDOMWrapNSNormGatherInScopeNs((xmlNsMapPtr *)&mi,_ret);
        if (iVar4 == -1) {
          cur._0_4_ = -1;
        }
        bVar3 = true;
      }
      if ((mi != (xmlNsMapItemPtr_conflict)0x0) && (mi->next != (xmlNsMapItemPtr)0x0)) {
        for (ns = (xmlNsPtr)mi->next; ns != (xmlNsPtr)0x0; ns = ns->next) {
          if ((*(int *)&ns->_private == -1) && (curElem->ns == (xmlNs *)ns->href)) {
            curElem->ns = (xmlNs *)ns->prefix;
            goto LAB_0016fe6a;
          }
        }
      }
      if ((sourceDoc_local == (xmlDocPtr)0x0) || (sourceDoc_local->children == (_xmlNode *)0x0)) {
        if (_ret == (xmlNodePtr)0x0) {
          local_88 = (xmlNodePtr)0x0;
        }
        else {
          local_88 = (xmlNodePtr)nsMap;
        }
        iVar4 = xmlDOMWrapNSNormAcquireNormalizedNs
                          ((xmlDocPtr)destParent_local,local_88,curElem->ns,(xmlNsPtr *)&parnsdone,
                           (xmlNsMapPtr *)&mi,ancestorsOnly,0,
                           (uint)(curElem->type == XML_ATTRIBUTE_NODE));
        if (iVar4 == -1) {
          cur._0_4_ = -1;
        }
        curElem->ns = _parnsdone;
      }
      else {
        _parnsdone = (xmlNsPtr)
                     (*(code *)sourceDoc_local->children)
                               (sourceDoc_local,curElem,curElem->ns->href,curElem->ns->prefix);
        pxVar5 = xmlDOMWrapNsMapAddItem((xmlNsMapPtr *)&mi,-1,curElem->ns,_parnsdone,-4);
        if (pxVar5 == (xmlNsMapItemPtr_conflict)0x0) {
          cur._0_4_ = -1;
        }
        curElem->ns = _parnsdone;
      }
    }
LAB_0016fe6a:
    if (curElem->type == XML_ELEMENT_NODE) {
      curElem->psvi = (void *)0x0;
      curElem->line = 0;
      curElem->extra = 0;
      if (curElem->properties == (_xmlAttr *)0x0) goto LAB_0016febd;
      curElem = (xmlNodePtr)curElem->properties;
    }
    else {
LAB_0016febd:
      if (curElem->children == (_xmlNode *)0x0) break;
      curElem = curElem->children;
    }
    goto LAB_0016fb34;
  case XML_TEXT_NODE:
  case XML_CDATA_SECTION_NODE:
  case XML_ENTITY_REF_NODE:
  case XML_PI_NODE:
  case XML_COMMENT_NODE:
    break;
  default:
    cur._0_4_ = -1;
    goto LAB_0016febd;
  case XML_XINCLUDE_START:
  case XML_XINCLUDE_END:
    cur._0_4_ = -1;
  }
  while( true ) {
    if ((xmlDocPtr)curElem == destDoc_local) goto LAB_0017005f;
    if (((curElem->type == XML_ELEMENT_NODE) || (curElem->type == XML_XINCLUDE_START)) ||
       (curElem->type == XML_XINCLUDE_END)) {
      if ((mi != (xmlNsMapItemPtr_conflict)0x0) && (mi->next != (xmlNsMapItemPtr)0x0)) {
        while( true ) {
          bVar2 = false;
          if (mi->prev != (xmlNsMapItemPtr)0x0) {
            bVar2 = ancestorsOnly <= mi->prev->depth;
          }
          if (!bVar2) break;
          pxVar1 = (xmlNsPtr)mi->prev;
          mi->prev = *(xmlNsMapItemPtr *)&pxVar1->type;
          if (mi->prev == (xmlNsMapItemPtr)0x0) {
            mi->next = (xmlNsMapItemPtr)0x0;
          }
          else {
            mi->prev->next = (xmlNsMapItemPtr)0x0;
          }
          pxVar1->next = mi->oldNs;
          mi->oldNs = pxVar1;
        }
        for (ns = (xmlNsPtr)mi->next; ns != (xmlNsPtr)0x0; ns = ns->next) {
          if (ancestorsOnly <= *(int *)&ns->_private) {
            *(undefined4 *)&ns->_private = 0xffffffff;
          }
        }
      }
      ancestorsOnly = ancestorsOnly + -1;
    }
    if (curElem->next != (_xmlNode *)0x0) {
      curElem = curElem->next;
      goto LAB_0016fb34;
    }
    if ((curElem->type == XML_ATTRIBUTE_NODE) && (curElem->parent->children != (_xmlNode *)0x0))
    break;
    curElem = curElem->parent;
  }
  curElem = curElem->parent->children;
  goto LAB_0016fb34;
}

Assistant:

static int
xmlDOMWrapAdoptBranch(xmlDOMWrapCtxtPtr ctxt,
		      xmlDocPtr sourceDoc ATTRIBUTE_UNUSED,
		      xmlNodePtr node,
		      xmlDocPtr destDoc,
		      xmlNodePtr destParent,
		      int options ATTRIBUTE_UNUSED)
{
    int ret = 0;
    xmlNodePtr cur, curElem = NULL;
    xmlNsMapPtr nsMap = NULL;
    xmlNsMapItemPtr mi;
    xmlNsPtr ns = NULL;
    int depth = -1;
    /* gather @parent's ns-decls. */
    int parnsdone;
    /* @ancestorsOnly should be set per option. */
    int ancestorsOnly = 0;

    /*
    * Get the ns-map from the context if available.
    */
    if (ctxt)
	nsMap = (xmlNsMapPtr) ctxt->namespaceMap;
    /*
    * Disable search for ns-decls in the parent-axis of the
    * destination element, if:
    * 1) there's no destination parent
    * 2) custom ns-reference handling is used
    */
    if ((destParent == NULL) ||
	(ctxt && ctxt->getNsForNodeFunc))
    {
	parnsdone = 1;
    } else
	parnsdone = 0;

    cur = node;

    while (cur != NULL) {
        if (cur->doc != destDoc) {
            if (xmlNodeSetDoc(cur, destDoc) < 0)
                ret = -1;
        }

	switch (cur->type) {
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
		/*
		* TODO
		*/
		ret = -1;
                goto leave_node;
	    case XML_ELEMENT_NODE:
		curElem = cur;
		depth++;
		/*
		* Namespace declarations.
		* - ns->href and ns->prefix are never in the dict, so
		*   we need not move the values over to the destination dict.
		* - Note that for custom handling of ns-references,
		*   the ns-decls need not be stored in the ns-map,
		*   since they won't be referenced by node->ns.
		*/
		if ((cur->nsDef) &&
		    ((ctxt == NULL) || (ctxt->getNsForNodeFunc == NULL)))
		{
		    if (! parnsdone) {
			/*
			* Gather @parent's in-scope ns-decls.
			*/
			if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap,
			    destParent) == -1)
			    ret = -1;
			parnsdone = 1;
		    }
		    for (ns = cur->nsDef; ns != NULL; ns = ns->next) {
			/*
			* NOTE: ns->prefix and ns->href are never in the dict.
			*/
			/*
			* Does it shadow any ns-decl?
			*/
			if (XML_NSMAP_NOTEMPTY(nsMap)) {
			    XML_NSMAP_FOREACH(nsMap, mi) {
				if ((mi->depth >= XML_TREE_NSMAP_PARENT) &&
				    (mi->shadowDepth == -1) &&
				    ((ns->prefix == mi->newNs->prefix) ||
				    xmlStrEqual(ns->prefix,
				    mi->newNs->prefix))) {

				    mi->shadowDepth = depth;
				}
			    }
			}
			/*
			* Push mapping.
			*/
			if (xmlDOMWrapNsMapAddItem(&nsMap, -1,
			    ns, ns, depth) == NULL)
			    ret = -1;
		    }
		}
                /* Falls through. */
	    case XML_ATTRIBUTE_NODE:
		/* No namespace, no fun. */
		if (cur->ns == NULL)
		    goto ns_end;

		if (! parnsdone) {
		    if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap,
			destParent) == -1)
			ret = -1;
		    parnsdone = 1;
		}
		/*
		* Adopt ns-references.
		*/
		if (XML_NSMAP_NOTEMPTY(nsMap)) {
		    /*
		    * Search for a mapping.
		    */
		    XML_NSMAP_FOREACH(nsMap, mi) {
			if ((mi->shadowDepth == -1) &&
			    (cur->ns == mi->oldNs)) {

			    cur->ns = mi->newNs;
			    goto ns_end;
			}
		    }
		}
		/*
		* No matching namespace in scope. We need a new one.
		*/
		if ((ctxt) && (ctxt->getNsForNodeFunc)) {
		    /*
		    * User-defined behaviour.
		    */
		    ns = ctxt->getNsForNodeFunc(ctxt, cur,
			cur->ns->href, cur->ns->prefix);
		    /*
		    * Insert mapping if ns is available; it's the users fault
		    * if not.
		    */
		    if (xmlDOMWrapNsMapAddItem(&nsMap, -1,
			    cur->ns, ns, XML_TREE_NSMAP_CUSTOM) == NULL)
			ret = -1;
		    cur->ns = ns;
		} else {
		    /*
		    * Acquire a normalized ns-decl and add it to the map.
		    */
		    if (xmlDOMWrapNSNormAcquireNormalizedNs(destDoc,
			/* ns-decls on curElem or on destDoc->oldNs */
			destParent ? curElem : NULL,
			cur->ns, &ns,
			&nsMap, depth,
			ancestorsOnly,
			/* ns-decls must be prefixed for attributes. */
			(cur->type == XML_ATTRIBUTE_NODE) ? 1 : 0) == -1)
			ret = -1;
		    cur->ns = ns;
		}

ns_end:
		if (cur->type == XML_ELEMENT_NODE) {
		    cur->psvi = NULL;
		    cur->line = 0;
		    cur->extra = 0;
		    /*
		    * Walk attributes.
		    */
		    if (cur->properties != NULL) {
			/*
			* Process first attribute node.
			*/
			cur = (xmlNodePtr) cur->properties;
			continue;
		    }
		}
		break;
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
	    case XML_PI_NODE:
	    case XML_COMMENT_NODE:
	    case XML_ENTITY_REF_NODE:
		goto leave_node;
	    default:
		ret = -1;
	}
	/*
	* Walk the tree.
	*/
	if (cur->children != NULL) {
	    cur = cur->children;
	    continue;
	}

leave_node:
	if (cur == node)
	    break;
	if ((cur->type == XML_ELEMENT_NODE) ||
	    (cur->type == XML_XINCLUDE_START) ||
	    (cur->type == XML_XINCLUDE_END))
	{
	    /*
	    * TODO: Do we expect nsDefs on XML_XINCLUDE_START?
	    */
	    if (XML_NSMAP_NOTEMPTY(nsMap)) {
		/*
		* Pop mappings.
		*/
		while ((nsMap->last != NULL) &&
		    (nsMap->last->depth >= depth))
		{
		    XML_NSMAP_POP(nsMap, mi)
		}
		/*
		* Unshadow.
		*/
		XML_NSMAP_FOREACH(nsMap, mi) {
		    if (mi->shadowDepth >= depth)
			mi->shadowDepth = -1;
		}
	    }
	    depth--;
	}
	if (cur->next != NULL)
	    cur = cur->next;
	else if ((cur->type == XML_ATTRIBUTE_NODE) &&
	    (cur->parent->children != NULL))
	{
	    cur = cur->parent->children;
	} else {
	    cur = cur->parent;
	    goto leave_node;
	}
    }

    /*
    * Cleanup.
    */
    if (nsMap != NULL) {
	if ((ctxt) && (ctxt->namespaceMap == nsMap)) {
	    /*
	    * Just cleanup the map but don't free.
	    */
	    if (nsMap->first) {
		if (nsMap->pool)
		    nsMap->last->next = nsMap->pool;
		nsMap->pool = nsMap->first;
		nsMap->first = NULL;
	    }
	} else
	    xmlDOMWrapNsMapFree(nsMap);
    }
    return(ret);
}